

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O3

void __thiscall gutil::Properties::save(Properties *this,char *name,char *comment)

{
  long lVar1;
  ofstream out;
  undefined1 auStack_258 [48];
  long local_228;
  filebuf local_220 [20];
  undefined4 auStack_20c [55];
  ios_base local_130 [264];
  
  std::ofstream::ofstream(&local_228);
  lVar1 = *(long *)(local_228 + -0x18);
  *(undefined4 *)((long)auStack_20c + lVar1) = 7;
  std::ios::clear((int)auStack_258 + (int)lVar1 + 0x30);
  std::ofstream::open((char *)&local_228,(_Ios_Openmode)name);
  save(this,(ostream *)&local_228,comment);
  std::ofstream::close();
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void Properties::save(const char *name, const char *comment) const
{
  std::ofstream out;

  try
  {
    out.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
    out.open(name);

    save(out, comment);

    out.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw IOException(ex.what());
  }
}